

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort.cpp
# Opt level: O0

void merge_4way(uchar **from0,size_t n0,uchar **from1,size_t n1,uchar **from2,size_t n2,
               uchar **from3,size_t n3,uchar **result)

{
  int iVar1;
  undefined8 *puVar2;
  uchar **ppuVar3;
  uchar **ppuVar4;
  size_t local_38;
  size_t n2_local;
  uchar **from2_local;
  size_t n1_local;
  uchar **from1_local;
  size_t n0_local;
  uchar **from0_local;
  
  iVar1 = cmp(*from0,*from1);
  local_38 = n2;
  from2_local = (uchar **)n1;
  from1_local = (uchar **)n0;
  if (0 < iVar1) {
    iVar1 = cmp(*from1,*from2);
    if (0 < iVar1) {
      iVar1 = cmp(*from3,*from2);
      n2_local = (size_t)from2;
      n1_local = (size_t)from1;
      n0_local = (size_t)from0;
      if (iVar1 < 0) goto LAB_00269112;
      iVar1 = cmp(*from3,*from1);
      n2_local = (size_t)from2;
      n1_local = (size_t)from1;
      n0_local = (size_t)from0;
      if (iVar1 < 0) goto LAB_00268986;
      iVar1 = cmp(*from3,*from0);
      n2_local = (size_t)from2;
      n1_local = (size_t)from1;
      n0_local = (size_t)from0;
      if (iVar1 < 0) goto LAB_00268702;
      goto LAB_002685c0;
    }
    iVar1 = cmp(*from0,*from2);
    if (0 < iVar1) {
      iVar1 = cmp(*from3,*from1);
      n2_local = (size_t)from2;
      n1_local = (size_t)from1;
      n0_local = (size_t)from0;
      if (iVar1 < 0) goto LAB_00268e8e;
      iVar1 = cmp(*from3,*from2);
      n2_local = (size_t)from2;
      n1_local = (size_t)from1;
      n0_local = (size_t)from0;
      if (iVar1 < 0) goto LAB_002681fa;
      iVar1 = cmp(*from3,*from0);
      n2_local = (size_t)from2;
      n1_local = (size_t)from1;
      n0_local = (size_t)from0;
      if (iVar1 < 0) goto LAB_00267f76;
      goto LAB_00267e34;
    }
    iVar1 = cmp(*from3,*from1);
    n2_local = (size_t)from2;
    n1_local = (size_t)from1;
    n0_local = (size_t)from0;
    if (iVar1 < 0) goto LAB_00268d4c;
    iVar1 = cmp(*from3,*from0);
    n2_local = (size_t)from2;
    n1_local = (size_t)from1;
    n0_local = (size_t)from0;
    if (iVar1 < 0) goto LAB_002680b8;
    iVar1 = cmp(*from3,*from2);
    ppuVar4 = result;
    goto joined_r0x00267360;
  }
  iVar1 = cmp(*from1,*from2);
  if (0 < iVar1) {
    iVar1 = cmp(*from2,*from0);
    if (iVar1 < 0) {
      iVar1 = cmp(*from3,*from2);
      n2_local = (size_t)from2;
      n1_local = (size_t)from1;
      n0_local = (size_t)from0;
      if (iVar1 < 0) goto LAB_00268fd0;
      iVar1 = cmp(*from3,*from0);
      n2_local = (size_t)from2;
      n1_local = (size_t)from1;
      n0_local = (size_t)from0;
      if (iVar1 < 0) goto LAB_00268844;
      iVar1 = cmp(*from3,*from1);
      ppuVar4 = result;
      goto joined_r0x00267274;
    }
    iVar1 = cmp(*from3,*from0);
    n2_local = (size_t)from2;
    n1_local = (size_t)from1;
    n0_local = (size_t)from0;
    if (iVar1 < 0) goto LAB_00268c0a;
    iVar1 = cmp(*from3,*from2);
    n2_local = (size_t)from2;
    n1_local = (size_t)from1;
    n0_local = (size_t)from0;
    if (iVar1 < 0) goto LAB_00267a6e;
    iVar1 = cmp(*from3,*from1);
    ppuVar4 = result;
    goto joined_r0x002672d0;
  }
  iVar1 = cmp(*from3,*from0);
  n2_local = (size_t)from2;
  n1_local = (size_t)from1;
  n0_local = (size_t)from0;
  if (-1 < iVar1) {
    iVar1 = cmp(*from3,*from1);
    n2_local = (size_t)from2;
    n1_local = (size_t)from1;
    n0_local = (size_t)from0;
    if (iVar1 < 0) goto LAB_0026792c;
    iVar1 = cmp(*from3,*from2);
    ppuVar4 = result;
    goto joined_r0x00267200;
  }
LAB_00268ac8:
  do {
    iVar1 = cmp(*from3,*(void **)n0_local);
    if (0 < iVar1) {
      __assert_fail("cmp(*from3, *from0) <= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                    ,0x1b4,
                    "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                   );
    }
    iVar1 = cmp(*(void **)n0_local,*(void **)n1_local);
    if (0 < iVar1) {
      __assert_fail("cmp(*from0, *from1) <= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                    ,0x1b4,
                    "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                   );
    }
    iVar1 = cmp(*(void **)n1_local,*(void **)n2_local);
    if (0 < iVar1) {
      __assert_fail("cmp(*from1, *from2) <= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                    ,0x1b4,
                    "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                   );
    }
    ppuVar3 = from3 + 1;
    ppuVar4 = result + 1;
    *result = *from3;
    n3 = n3 - 1;
    result = ppuVar4;
    if (n3 == 0) {
LAB_00269347:
      merge_3way((uchar **)n0_local,(size_t)from1_local,(uchar **)n1_local,(size_t)from2_local,
                 (uchar **)n2_local,local_38,result);
      return;
    }
    iVar1 = cmp(*ppuVar3,*(void **)n0_local);
    from3 = ppuVar3;
  } while (iVar1 < 0);
  iVar1 = cmp(*ppuVar3,*(void **)n1_local);
  if (iVar1 < 0) goto LAB_0026792c;
  iVar1 = cmp(*ppuVar3,*(void **)n2_local);
  from0 = (uchar **)n0_local;
  from1 = (uchar **)n1_local;
  from2 = (uchar **)n2_local;
joined_r0x00267200:
  result = ppuVar4;
  n2_local = (size_t)from2;
  n1_local = (size_t)from1;
  n0_local = (size_t)from0;
  if (iVar1 < 0) goto LAB_00267566;
LAB_00267424:
  do {
    do {
      iVar1 = cmp(*(void **)n0_local,*(void **)n1_local);
      if (0 < iVar1) {
        __assert_fail("cmp(*from0, *from1) <= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                      ,0x1ae,
                      "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                     );
      }
      iVar1 = cmp(*(void **)n1_local,*(void **)n2_local);
      if (0 < iVar1) {
        __assert_fail("cmp(*from1, *from2) <= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                      ,0x1ae,
                      "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                     );
      }
      iVar1 = cmp(*(void **)n2_local,*from3);
      if (0 < iVar1) {
        __assert_fail("cmp(*from2, *from3) <= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                      ,0x1ae,
                      "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                     );
      }
      puVar2 = (undefined8 *)(n0_local + 8);
      ppuVar4 = result + 1;
      *result = *(uchar **)n0_local;
      from1_local = (uchar **)((long)from1_local + -1);
      result = ppuVar4;
      if (from1_local == (uchar **)0x0) {
LAB_00269254:
        merge_3way((uchar **)n1_local,(size_t)from2_local,(uchar **)n2_local,local_38,from3,n3,
                   result);
        return;
      }
      iVar1 = cmp((void *)*puVar2,*(void **)n1_local);
      n0_local = (size_t)puVar2;
    } while (iVar1 < 1);
    iVar1 = cmp((void *)*puVar2,*(void **)n2_local);
    if (0 < iVar1) {
      iVar1 = cmp((void *)*puVar2,*from3);
      if (0 < iVar1) goto LAB_00267f76;
      goto LAB_00267e34;
    }
LAB_00267bb0:
    do {
      iVar1 = cmp(*(void **)n1_local,*(void **)n0_local);
      if (0 < iVar1) {
        __assert_fail("cmp(*from1, *from0) <= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                      ,0x1b0,
                      "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                     );
      }
      iVar1 = cmp(*(void **)n0_local,*(void **)n2_local);
      if (0 < iVar1) {
        __assert_fail("cmp(*from0, *from2) <= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                      ,0x1b0,
                      "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                     );
      }
      iVar1 = cmp(*(void **)n2_local,*from3);
      if (0 < iVar1) {
        __assert_fail("cmp(*from2, *from3) <= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                      ,0x1b0,
                      "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                     );
      }
      puVar2 = (undefined8 *)(n1_local + 8);
      ppuVar4 = result + 1;
      *result = *(uchar **)n1_local;
      from2_local = (uchar **)((long)from2_local + -1);
      result = ppuVar4;
      if (from2_local == (uchar **)0x0) {
LAB_002692a6:
        merge_3way((uchar **)n0_local,(size_t)from1_local,(uchar **)n2_local,local_38,from3,n3,
                   result);
        return;
      }
      iVar1 = cmp((void *)*puVar2,*(void **)n0_local);
      n1_local = (size_t)puVar2;
    } while (iVar1 < 0);
    iVar1 = cmp((void *)*puVar2,*(void **)n2_local);
  } while (iVar1 < 1);
  iVar1 = cmp((void *)*puVar2,*from3);
  if (0 < iVar1) goto LAB_002677ea;
LAB_002676a8:
  do {
    iVar1 = cmp(*(void **)n0_local,*(void **)n2_local);
    if (0 < iVar1) {
      __assert_fail("cmp(*from0, *from2) <= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                    ,0x1ae,
                    "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                   );
    }
    iVar1 = cmp(*(void **)n2_local,*(void **)n1_local);
    if (0 < iVar1) {
      __assert_fail("cmp(*from2, *from1) <= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                    ,0x1ae,
                    "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                   );
    }
    iVar1 = cmp(*(void **)n1_local,*from3);
    if (0 < iVar1) {
      __assert_fail("cmp(*from1, *from3) <= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                    ,0x1ae,
                    "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                   );
    }
    puVar2 = (undefined8 *)(n0_local + 8);
    ppuVar4 = result + 1;
    *result = *(uchar **)n0_local;
    from1_local = (uchar **)((long)from1_local + -1);
    result = ppuVar4;
    if (from1_local == (uchar **)0x0) goto LAB_00269254;
    iVar1 = cmp((void *)*puVar2,*(void **)n2_local);
    n0_local = (size_t)puVar2;
    if (0 < iVar1) {
      iVar1 = cmp((void *)*puVar2,*(void **)n1_local);
      if (iVar1 < 1) goto LAB_0026833c;
      iVar1 = cmp((void *)*puVar2,*from3);
      if (0 < iVar1) goto LAB_00268702;
LAB_002685c0:
      do {
        do {
          iVar1 = cmp(*(void **)n2_local,*(void **)n1_local);
          if (0 < iVar1) {
            __assert_fail("cmp(*from2, *from1) <= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                          ,0x1b2,
                          "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                         );
          }
          iVar1 = cmp(*(void **)n1_local,*(void **)n0_local);
          if (0 < iVar1) {
            __assert_fail("cmp(*from1, *from0) <= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                          ,0x1b2,
                          "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                         );
          }
          iVar1 = cmp(*(void **)n0_local,*from3);
          if (0 < iVar1) {
            __assert_fail("cmp(*from0, *from3) <= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                          ,0x1b2,
                          "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                         );
          }
          puVar2 = (undefined8 *)(n2_local + 8);
          ppuVar4 = result + 1;
          *result = *(uchar **)n2_local;
          local_38 = local_38 - 1;
          result = ppuVar4;
          if (local_38 == 0) {
LAB_002692f8:
            merge_3way((uchar **)n0_local,(size_t)from1_local,(uchar **)n1_local,(size_t)from2_local
                       ,from3,n3,result);
            return;
          }
          iVar1 = cmp((void *)*puVar2,*(void **)n1_local);
          n2_local = (size_t)puVar2;
        } while (iVar1 < 0);
        iVar1 = cmp((void *)*puVar2,*(void **)n0_local);
        if (-1 < iVar1) {
          iVar1 = cmp((void *)*puVar2,*from3);
          if (0 < iVar1) goto LAB_00267cf2;
          goto LAB_00267bb0;
        }
LAB_00267e34:
        do {
          iVar1 = cmp(*(void **)n1_local,*(void **)n2_local);
          if (0 < iVar1) {
            __assert_fail("cmp(*from1, *from2) <= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                          ,0x1b0,
                          "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                         );
          }
          iVar1 = cmp(*(void **)n2_local,*(void **)n0_local);
          if (0 < iVar1) {
            __assert_fail("cmp(*from2, *from0) <= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                          ,0x1b0,
                          "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                         );
          }
          iVar1 = cmp(*(void **)n0_local,*from3);
          if (0 < iVar1) {
            __assert_fail("cmp(*from0, *from3) <= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                          ,0x1b0,
                          "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                         );
          }
          puVar2 = (undefined8 *)(n1_local + 8);
          ppuVar4 = result + 1;
          *result = *(uchar **)n1_local;
          from2_local = (uchar **)((long)from2_local + -1);
          result = ppuVar4;
          if (from2_local == (uchar **)0x0) goto LAB_002692a6;
          iVar1 = cmp((void *)*puVar2,*(void **)n2_local);
          n1_local = (size_t)puVar2;
        } while (iVar1 < 1);
        iVar1 = cmp((void *)*puVar2,*(void **)n0_local);
        if (-1 < iVar1) {
          iVar1 = cmp((void *)*puVar2,*from3);
          if (0 < iVar1) goto LAB_0026847e;
LAB_0026833c:
          while( true ) {
            do {
              iVar1 = cmp(*(void **)n2_local,*(void **)n0_local);
              if (0 < iVar1) {
                __assert_fail("cmp(*from2, *from0) <= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                              ,0x1b2,
                              "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                             );
              }
              iVar1 = cmp(*(void **)n0_local,*(void **)n1_local);
              if (0 < iVar1) {
                __assert_fail("cmp(*from0, *from1) <= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                              ,0x1b2,
                              "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                             );
              }
              iVar1 = cmp(*(void **)n1_local,*from3);
              if (0 < iVar1) {
                __assert_fail("cmp(*from1, *from3) <= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                              ,0x1b2,
                              "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                             );
              }
              puVar2 = (undefined8 *)(n2_local + 8);
              ppuVar4 = result + 1;
              *result = *(uchar **)n2_local;
              local_38 = local_38 - 1;
              result = ppuVar4;
              if (local_38 == 0) goto LAB_002692f8;
              iVar1 = cmp((void *)*puVar2,*(void **)n0_local);
              n2_local = (size_t)puVar2;
            } while (iVar1 < 0);
            iVar1 = cmp((void *)*puVar2,*(void **)n1_local);
            if (iVar1 < 0) break;
            iVar1 = cmp((void *)*puVar2,*from3);
            if (iVar1 < 1) goto LAB_00267424;
LAB_00267566:
            do {
              iVar1 = cmp(*(void **)n0_local,*(void **)n1_local);
              if (0 < iVar1) {
                __assert_fail("cmp(*from0, *from1) <= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                              ,0x1ae,
                              "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                             );
              }
              iVar1 = cmp(*(void **)n1_local,*from3);
              if (0 < iVar1) {
                __assert_fail("cmp(*from1, *from3) <= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                              ,0x1ae,
                              "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                             );
              }
              iVar1 = cmp(*from3,*(void **)n2_local);
              if (0 < iVar1) {
                __assert_fail("cmp(*from3, *from2) <= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                              ,0x1ae,
                              "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                             );
              }
              puVar2 = (undefined8 *)(n0_local + 8);
              ppuVar4 = result + 1;
              *result = *(uchar **)n0_local;
              from1_local = (uchar **)((long)from1_local + -1);
              result = ppuVar4;
              if (from1_local == (uchar **)0x0) goto LAB_00269254;
              iVar1 = cmp((void *)*puVar2,*(void **)n1_local);
              n0_local = (size_t)puVar2;
            } while (iVar1 < 1);
            iVar1 = cmp((void *)*puVar2,*from3);
            if (iVar1 < 1) goto LAB_00267cf2;
            iVar1 = cmp((void *)*puVar2,*(void **)n2_local);
            if (iVar1 < 1) goto LAB_002680b8;
LAB_002681fa:
            do {
              iVar1 = cmp(*(void **)n1_local,*from3);
              if (0 < iVar1) {
                __assert_fail("cmp(*from1, *from3) <= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                              ,0x1b1,
                              "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                             );
              }
              iVar1 = cmp(*from3,*(void **)n2_local);
              if (0 < iVar1) {
                __assert_fail("cmp(*from3, *from2) <= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                              ,0x1b1,
                              "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                             );
              }
              iVar1 = cmp(*(void **)n2_local,*(void **)n0_local);
              if (0 < iVar1) {
                __assert_fail("cmp(*from2, *from0) <= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                              ,0x1b1,
                              "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                             );
              }
              puVar2 = (undefined8 *)(n1_local + 8);
              ppuVar4 = result + 1;
              *result = *(uchar **)n1_local;
              from2_local = (uchar **)((long)from2_local + -1);
              result = ppuVar4;
              if (from2_local == (uchar **)0x0) goto LAB_002692a6;
              iVar1 = cmp((void *)*puVar2,*from3);
              n1_local = (size_t)puVar2;
            } while (iVar1 < 1);
            iVar1 = cmp((void *)*puVar2,*(void **)n2_local);
            if (iVar1 < 1) goto LAB_00268e8e;
            iVar1 = cmp((void *)*puVar2,*(void **)n0_local);
            if (-1 < iVar1) goto LAB_00268fd0;
LAB_00269112:
            do {
              iVar1 = cmp(*from3,*(void **)n2_local);
              if (0 < iVar1) {
                __assert_fail("cmp(*from3, *from2) <= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                              ,0x1b5,
                              "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                             );
              }
              iVar1 = cmp(*(void **)n2_local,*(void **)n1_local);
              if (0 < iVar1) {
                __assert_fail("cmp(*from2, *from1) <= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                              ,0x1b5,
                              "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                             );
              }
              iVar1 = cmp(*(void **)n1_local,*(void **)n0_local);
              if (0 < iVar1) {
                __assert_fail("cmp(*from1, *from0) <= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                              ,0x1b5,
                              "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                             );
              }
              ppuVar4 = from3 + 1;
              ppuVar3 = result + 1;
              *result = *from3;
              n3 = n3 - 1;
              result = ppuVar3;
              if (n3 == 0) goto LAB_00269347;
              iVar1 = cmp(*ppuVar4,*(void **)n2_local);
              from3 = ppuVar4;
            } while (iVar1 < 0);
            iVar1 = cmp(*ppuVar4,*(void **)n1_local);
            if (iVar1 < 0) goto LAB_00268986;
            iVar1 = cmp(*ppuVar4,*(void **)n0_local);
            if (-1 < iVar1) goto LAB_002685c0;
LAB_00268702:
            do {
              iVar1 = cmp(*(void **)n2_local,*(void **)n1_local);
              if (0 < iVar1) {
                __assert_fail("cmp(*from2, *from1) <= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                              ,0x1b3,
                              "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                             );
              }
              iVar1 = cmp(*(void **)n1_local,*from3);
              if (0 < iVar1) {
                __assert_fail("cmp(*from1, *from3) <= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                              ,0x1b3,
                              "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                             );
              }
              iVar1 = cmp(*from3,*(void **)n0_local);
              if (0 < iVar1) {
                __assert_fail("cmp(*from3, *from0) <= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                              ,0x1b3,
                              "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                             );
              }
              puVar2 = (undefined8 *)(n2_local + 8);
              ppuVar4 = result + 1;
              *result = *(uchar **)n2_local;
              local_38 = local_38 - 1;
              result = ppuVar4;
              if (local_38 == 0) goto LAB_002692f8;
              iVar1 = cmp((void *)*puVar2,*(void **)n1_local);
              n2_local = (size_t)puVar2;
            } while (iVar1 < 0);
            iVar1 = cmp((void *)*puVar2,*from3);
            if (iVar1 < 1) goto LAB_00267f76;
            iVar1 = cmp((void *)*puVar2,*(void **)n0_local);
            if (iVar1 < 0) goto LAB_002681fa;
LAB_002680b8:
            do {
              iVar1 = cmp(*(void **)n1_local,*from3);
              if (0 < iVar1) {
                __assert_fail("cmp(*from1, *from3) <= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                              ,0x1b1,
                              "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                             );
              }
              iVar1 = cmp(*from3,*(void **)n0_local);
              if (0 < iVar1) {
                __assert_fail("cmp(*from3, *from0) <= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                              ,0x1b1,
                              "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                             );
              }
              iVar1 = cmp(*(void **)n0_local,*(void **)n2_local);
              if (0 < iVar1) {
                __assert_fail("cmp(*from0, *from2) <= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                              ,0x1b1,
                              "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                             );
              }
              puVar2 = (undefined8 *)(n1_local + 8);
              ppuVar4 = result + 1;
              *result = *(uchar **)n1_local;
              from2_local = (uchar **)((long)from2_local + -1);
              result = ppuVar4;
              if (from2_local == (uchar **)0x0) goto LAB_002692a6;
              iVar1 = cmp((void *)*puVar2,*from3);
              n1_local = (size_t)puVar2;
            } while (iVar1 < 1);
            iVar1 = cmp((void *)*puVar2,*(void **)n0_local);
            if (-1 < iVar1) {
              iVar1 = cmp((void *)*puVar2,*(void **)n2_local);
              if (0 < iVar1) goto LAB_00268c0a;
              goto LAB_00268ac8;
            }
LAB_00268d4c:
            do {
              iVar1 = cmp(*from3,*(void **)n1_local);
              if (0 < iVar1) {
                __assert_fail("cmp(*from3, *from1) <= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                              ,0x1b4,
                              "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                             );
              }
              iVar1 = cmp(*(void **)n1_local,*(void **)n0_local);
              if (0 < iVar1) {
                __assert_fail("cmp(*from1, *from0) <= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                              ,0x1b4,
                              "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                             );
              }
              iVar1 = cmp(*(void **)n0_local,*(void **)n2_local);
              if (0 < iVar1) {
                __assert_fail("cmp(*from0, *from2) <= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                              ,0x1b4,
                              "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                             );
              }
              ppuVar3 = from3 + 1;
              ppuVar4 = result + 1;
              *result = *from3;
              n3 = n3 - 1;
              result = ppuVar4;
              if (n3 == 0) goto LAB_00269347;
              iVar1 = cmp(*ppuVar3,*(void **)n1_local);
              from3 = ppuVar3;
            } while (iVar1 < 0);
            iVar1 = cmp(*ppuVar3,*(void **)n0_local);
            if (iVar1 < 0) goto LAB_002680b8;
            iVar1 = cmp(*ppuVar3,*(void **)n2_local);
            from0 = (uchar **)n0_local;
            from1 = (uchar **)n1_local;
            from2 = (uchar **)n2_local;
joined_r0x00267360:
            result = ppuVar4;
            n2_local = (size_t)from2;
            n1_local = (size_t)from1;
            n0_local = (size_t)from0;
            if (-1 < iVar1) goto LAB_00267bb0;
LAB_00267cf2:
            do {
              iVar1 = cmp(*(void **)n1_local,*(void **)n0_local);
              if (0 < iVar1) {
                __assert_fail("cmp(*from1, *from0) <= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                              ,0x1b0,
                              "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                             );
              }
              iVar1 = cmp(*(void **)n0_local,*from3);
              if (0 < iVar1) {
                __assert_fail("cmp(*from0, *from3) <= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                              ,0x1b0,
                              "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                             );
              }
              iVar1 = cmp(*from3,*(void **)n2_local);
              if (0 < iVar1) {
                __assert_fail("cmp(*from3, *from2) <= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                              ,0x1b0,
                              "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                             );
              }
              puVar2 = (undefined8 *)(n1_local + 8);
              ppuVar4 = result + 1;
              *result = *(uchar **)n1_local;
              from2_local = (uchar **)((long)from2_local + -1);
              result = ppuVar4;
              if (from2_local == (uchar **)0x0) goto LAB_002692a6;
              iVar1 = cmp((void *)*puVar2,*(void **)n0_local);
              n1_local = (size_t)puVar2;
            } while (iVar1 < 0);
            iVar1 = cmp((void *)*puVar2,*from3);
            if (iVar1 < 1) goto LAB_00267566;
            iVar1 = cmp((void *)*puVar2,*(void **)n2_local);
            if (iVar1 < 1) goto LAB_0026792c;
LAB_00267a6e:
            do {
              iVar1 = cmp(*(void **)n0_local,*from3);
              if (0 < iVar1) {
                __assert_fail("cmp(*from0, *from3) <= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                              ,0x1af,
                              "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                             );
              }
              iVar1 = cmp(*from3,*(void **)n2_local);
              if (0 < iVar1) {
                __assert_fail("cmp(*from3, *from2) <= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                              ,0x1af,
                              "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                             );
              }
              iVar1 = cmp(*(void **)n2_local,*(void **)n1_local);
              if (0 < iVar1) {
                __assert_fail("cmp(*from2, *from1) <= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                              ,0x1af,
                              "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                             );
              }
              puVar2 = (undefined8 *)(n0_local + 8);
              ppuVar4 = result + 1;
              *result = *(uchar **)n0_local;
              from1_local = (uchar **)((long)from1_local + -1);
              result = ppuVar4;
              if (from1_local == (uchar **)0x0) goto LAB_00269254;
              iVar1 = cmp((void *)*puVar2,*from3);
              n0_local = (size_t)puVar2;
            } while (iVar1 < 1);
            iVar1 = cmp((void *)*puVar2,*(void **)n2_local);
            if (iVar1 < 1) goto LAB_00268c0a;
            iVar1 = cmp((void *)*puVar2,*(void **)n1_local);
            if (0 < iVar1) goto LAB_00269112;
LAB_00268fd0:
            while( true ) {
              do {
                iVar1 = cmp(*from3,*(void **)n2_local);
                if (0 < iVar1) {
                  __assert_fail("cmp(*from3, *from2) <= 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                                ,0x1b5,
                                "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                               );
                }
                iVar1 = cmp(*(void **)n2_local,*(void **)n0_local);
                if (0 < iVar1) {
                  __assert_fail("cmp(*from2, *from0) <= 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                                ,0x1b5,
                                "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                               );
                }
                iVar1 = cmp(*(void **)n0_local,*(void **)n1_local);
                if (0 < iVar1) {
                  __assert_fail("cmp(*from0, *from1) <= 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                                ,0x1b5,
                                "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                               );
                }
                ppuVar3 = from3 + 1;
                ppuVar4 = result + 1;
                *result = *from3;
                n3 = n3 - 1;
                result = ppuVar4;
                if (n3 == 0) goto LAB_00269347;
                iVar1 = cmp(*ppuVar3,*(void **)n2_local);
                from3 = ppuVar3;
              } while (iVar1 < 0);
              iVar1 = cmp(*ppuVar3,*(void **)n0_local);
              if (-1 < iVar1) break;
LAB_00268844:
              do {
                iVar1 = cmp(*(void **)n2_local,*from3);
                if (0 < iVar1) {
                  __assert_fail("cmp(*from2, *from3) <= 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                                ,0x1b3,
                                "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                               );
                }
                iVar1 = cmp(*from3,*(void **)n0_local);
                if (0 < iVar1) {
                  __assert_fail("cmp(*from3, *from0) <= 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                                ,0x1b3,
                                "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                               );
                }
                iVar1 = cmp(*(void **)n0_local,*(void **)n1_local);
                if (0 < iVar1) {
                  __assert_fail("cmp(*from0, *from1) <= 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                                ,0x1b3,
                                "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                               );
                }
                puVar2 = (undefined8 *)(n2_local + 8);
                ppuVar4 = result + 1;
                *result = *(uchar **)n2_local;
                local_38 = local_38 - 1;
                result = ppuVar4;
                if (local_38 == 0) goto LAB_002692f8;
                iVar1 = cmp((void *)*puVar2,*from3);
                n2_local = (size_t)puVar2;
              } while (iVar1 < 1);
              iVar1 = cmp((void *)*puVar2,*(void **)n0_local);
              if (-1 < iVar1) {
                iVar1 = cmp((void *)*puVar2,*(void **)n1_local);
                if (-1 < iVar1) goto LAB_00268ac8;
LAB_00268c0a:
                do {
                  iVar1 = cmp(*from3,*(void **)n0_local);
                  if (0 < iVar1) {
                    __assert_fail("cmp(*from3, *from0) <= 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                                  ,0x1b4,
                                  "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                                 );
                  }
                  iVar1 = cmp(*(void **)n0_local,*(void **)n2_local);
                  if (0 < iVar1) {
                    __assert_fail("cmp(*from0, *from2) <= 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                                  ,0x1b4,
                                  "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                                 );
                  }
                  iVar1 = cmp(*(void **)n2_local,*(void **)n1_local);
                  if (0 < iVar1) {
                    __assert_fail("cmp(*from2, *from1) <= 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                                  ,0x1b4,
                                  "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                                 );
                  }
                  ppuVar3 = from3 + 1;
                  ppuVar4 = result + 1;
                  *result = *from3;
                  n3 = n3 - 1;
                  result = ppuVar4;
                  if (n3 == 0) goto LAB_00269347;
                  iVar1 = cmp(*ppuVar3,*(void **)n0_local);
                  from3 = ppuVar3;
                } while (iVar1 < 0);
                iVar1 = cmp(*ppuVar3,*(void **)n2_local);
                if (iVar1 < 0) goto LAB_00267a6e;
                iVar1 = cmp(*ppuVar3,*(void **)n1_local);
                from0 = (uchar **)n0_local;
                from1 = (uchar **)n1_local;
                from2 = (uchar **)n2_local;
joined_r0x002672d0:
                result = ppuVar4;
                n2_local = (size_t)from2;
                n1_local = (size_t)from1;
                n0_local = (size_t)from0;
                if (-1 < iVar1) goto LAB_002676a8;
LAB_002677ea:
                do {
                  do {
                    iVar1 = cmp(*(void **)n0_local,*(void **)n2_local);
                    if (0 < iVar1) {
                      __assert_fail("cmp(*from0, *from2) <= 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                                    ,0x1af,
                                    "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                                   );
                    }
                    iVar1 = cmp(*(void **)n2_local,*from3);
                    if (0 < iVar1) {
                      __assert_fail("cmp(*from2, *from3) <= 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                                    ,0x1af,
                                    "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                                   );
                    }
                    iVar1 = cmp(*from3,*(void **)n1_local);
                    if (0 < iVar1) {
                      __assert_fail("cmp(*from3, *from1) <= 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                                    ,0x1af,
                                    "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                                   );
                    }
                    puVar2 = (undefined8 *)(n0_local + 8);
                    ppuVar4 = result + 1;
                    *result = *(uchar **)n0_local;
                    from1_local = (uchar **)((long)from1_local + -1);
                    result = ppuVar4;
                    if (from1_local == (uchar **)0x0) goto LAB_00269254;
                    iVar1 = cmp((void *)*puVar2,*(void **)n2_local);
                    n0_local = (size_t)puVar2;
                  } while (iVar1 < 1);
                  iVar1 = cmp((void *)*puVar2,*from3);
                  if (0 < iVar1) {
                    iVar1 = cmp((void *)*puVar2,*(void **)n1_local);
                    if (0 < iVar1) goto LAB_00268986;
                    goto LAB_00268844;
                  }
LAB_0026847e:
                  do {
                    iVar1 = cmp(*(void **)n2_local,*(void **)n0_local);
                    if (0 < iVar1) {
                      __assert_fail("cmp(*from2, *from0) <= 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                                    ,0x1b2,
                                    "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                                   );
                    }
                    iVar1 = cmp(*(void **)n0_local,*from3);
                    if (0 < iVar1) {
                      __assert_fail("cmp(*from0, *from3) <= 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                                    ,0x1b2,
                                    "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                                   );
                    }
                    iVar1 = cmp(*from3,*(void **)n1_local);
                    if (0 < iVar1) {
                      __assert_fail("cmp(*from3, *from1) <= 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                                    ,0x1b2,
                                    "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                                   );
                    }
                    puVar2 = (undefined8 *)(n2_local + 8);
                    ppuVar4 = result + 1;
                    *result = *(uchar **)n2_local;
                    local_38 = local_38 - 1;
                    result = ppuVar4;
                    if (local_38 == 0) goto LAB_002692f8;
                    iVar1 = cmp((void *)*puVar2,*(void **)n0_local);
                    n2_local = (size_t)puVar2;
                  } while (iVar1 < 0);
                  iVar1 = cmp((void *)*puVar2,*from3);
                } while (iVar1 < 1);
                iVar1 = cmp((void *)*puVar2,*(void **)n1_local);
                if (iVar1 < 0) goto LAB_00267a6e;
LAB_0026792c:
                do {
                  iVar1 = cmp(*(void **)n0_local,*from3);
                  if (0 < iVar1) {
                    __assert_fail("cmp(*from0, *from3) <= 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                                  ,0x1af,
                                  "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                                 );
                  }
                  iVar1 = cmp(*from3,*(void **)n1_local);
                  if (0 < iVar1) {
                    __assert_fail("cmp(*from3, *from1) <= 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                                  ,0x1af,
                                  "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                                 );
                  }
                  iVar1 = cmp(*(void **)n1_local,*(void **)n2_local);
                  if (0 < iVar1) {
                    __assert_fail("cmp(*from1, *from2) <= 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                                  ,0x1af,
                                  "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                                 );
                  }
                  puVar2 = (undefined8 *)(n0_local + 8);
                  ppuVar4 = result + 1;
                  *result = *(uchar **)n0_local;
                  from1_local = (uchar **)((long)from1_local + -1);
                  result = ppuVar4;
                  if (from1_local == (uchar **)0x0) goto LAB_00269254;
                  iVar1 = cmp((void *)*puVar2,*from3);
                  n0_local = (size_t)puVar2;
                } while (iVar1 < 1);
                iVar1 = cmp((void *)*puVar2,*(void **)n1_local);
                if (iVar1 < 1) goto LAB_00268ac8;
                iVar1 = cmp((void *)*puVar2,*(void **)n2_local);
                if (iVar1 < 1) goto LAB_00268d4c;
LAB_00268e8e:
                while( true ) {
                  do {
                    iVar1 = cmp(*from3,*(void **)n1_local);
                    if (0 < iVar1) {
                      __assert_fail("cmp(*from3, *from1) <= 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                                    ,0x1b5,
                                    "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                                   );
                    }
                    iVar1 = cmp(*(void **)n1_local,*(void **)n2_local);
                    if (0 < iVar1) {
                      __assert_fail("cmp(*from1, *from2) <= 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                                    ,0x1b5,
                                    "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                                   );
                    }
                    iVar1 = cmp(*(void **)n2_local,*(void **)n0_local);
                    if (0 < iVar1) {
                      __assert_fail("cmp(*from2, *from0) <= 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                                    ,0x1b5,
                                    "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                                   );
                    }
                    ppuVar4 = from3 + 1;
                    ppuVar3 = result + 1;
                    *result = *from3;
                    n3 = n3 - 1;
                    result = ppuVar3;
                    if (n3 == 0) goto LAB_00269347;
                    iVar1 = cmp(*ppuVar4,*(void **)n1_local);
                    from3 = ppuVar4;
                  } while (iVar1 < 0);
                  iVar1 = cmp(*ppuVar4,*(void **)n2_local);
                  if (iVar1 < 0) goto LAB_002681fa;
                  iVar1 = cmp(*ppuVar4,*(void **)n0_local);
                  if (-1 < iVar1) goto LAB_00267e34;
LAB_00267f76:
                  do {
                    iVar1 = cmp(*(void **)n1_local,*(void **)n2_local);
                    if (0 < iVar1) {
                      __assert_fail("cmp(*from1, *from2) <= 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                                    ,0x1b1,
                                    "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                                   );
                    }
                    iVar1 = cmp(*(void **)n2_local,*from3);
                    if (0 < iVar1) {
                      __assert_fail("cmp(*from2, *from3) <= 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                                    ,0x1b1,
                                    "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                                   );
                    }
                    iVar1 = cmp(*from3,*(void **)n0_local);
                    if (0 < iVar1) {
                      __assert_fail("cmp(*from3, *from0) <= 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                                    ,0x1b1,
                                    "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                                   );
                    }
                    puVar2 = (undefined8 *)(n1_local + 8);
                    ppuVar4 = result + 1;
                    *result = *(uchar **)n1_local;
                    from2_local = (uchar **)((long)from2_local + -1);
                    result = ppuVar4;
                    if (from2_local == (uchar **)0x0) goto LAB_002692a6;
                    iVar1 = cmp((void *)*puVar2,*(void **)n2_local);
                    n1_local = (size_t)puVar2;
                  } while (iVar1 < 1);
                  iVar1 = cmp((void *)*puVar2,*from3);
                  if (iVar1 < 1) goto LAB_00268702;
                  iVar1 = cmp((void *)*puVar2,*(void **)n0_local);
                  if (-1 < iVar1) break;
LAB_00268986:
                  do {
                    iVar1 = cmp(*(void **)n2_local,*from3);
                    if (0 < iVar1) {
                      __assert_fail("cmp(*from2, *from3) <= 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                                    ,0x1b3,
                                    "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                                   );
                    }
                    iVar1 = cmp(*from3,*(void **)n1_local);
                    if (0 < iVar1) {
                      __assert_fail("cmp(*from3, *from1) <= 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                                    ,0x1b3,
                                    "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                                   );
                    }
                    iVar1 = cmp(*(void **)n1_local,*(void **)n0_local);
                    if (0 < iVar1) {
                      __assert_fail("cmp(*from1, *from0) <= 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                                    ,0x1b3,
                                    "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                                   );
                    }
                    puVar2 = (undefined8 *)(n2_local + 8);
                    ppuVar4 = result + 1;
                    *result = *(uchar **)n2_local;
                    local_38 = local_38 - 1;
                    result = ppuVar4;
                    if (local_38 == 0) goto LAB_002692f8;
                    iVar1 = cmp((void *)*puVar2,*from3);
                    n2_local = (size_t)puVar2;
                  } while (iVar1 < 1);
                  iVar1 = cmp((void *)*puVar2,*(void **)n1_local);
                  if (iVar1 < 0) goto LAB_00269112;
                  iVar1 = cmp((void *)*puVar2,*(void **)n0_local);
                  if (-1 < iVar1) goto LAB_00268d4c;
                }
                goto LAB_00268844;
              }
            }
            iVar1 = cmp(*ppuVar3,*(void **)n1_local);
            from0 = (uchar **)n0_local;
            from1 = (uchar **)n1_local;
            from2 = (uchar **)n2_local;
joined_r0x00267274:
            result = ppuVar4;
            n2_local = (size_t)from2;
            n1_local = (size_t)from1;
            n0_local = (size_t)from0;
            if (iVar1 < 0) goto LAB_0026847e;
          }
          break;
        }
      } while( true );
    }
  } while( true );
}

Assistant:

static void
merge_4way(unsigned char** restrict from0, size_t n0,
           unsigned char** restrict from1, size_t n1,
           unsigned char** restrict from2, size_t n2,
           unsigned char** restrict from3, size_t n3,
           unsigned char** restrict result)
{
	debug()<<__func__<<"(), n0="<<n0<<", n1="<<n1<<", n2="<<n2
	       <<", n3="<<n3<<"\n";
	if (cmp(*from0, *from1) <= 0) {
		if (cmp(*from1, *from2) <= 0) {
			/* 0 <= 1 <= 2 */
			if (cmp(*from3, *from0) < 0) goto state_3012;
			if (cmp(*from3, *from1) < 0) goto state_0312;
			if (cmp(*from3, *from2) < 0) goto state_0132;
			goto state_0123;
		}
		if (cmp(*from2, *from0) < 0) {
			/* 2 < 0 <= 1 */
			if (cmp(*from3, *from2) < 0) goto state_3201;
			if (cmp(*from3, *from0) < 0) goto state_2301;
			if (cmp(*from3, *from1) < 0) goto state_2031;
			goto state_2013;
		}
		/* 0 <= 2 < 1 */
		if (cmp(*from3, *from0) < 0) goto state_3021;
		if (cmp(*from3, *from2) < 0) goto state_0321;
		if (cmp(*from3, *from1) < 0) goto state_0231;
		goto state_0213;
	}
	if (cmp(*from1, *from2) <= 0) {
		if (cmp(*from0, *from2) <= 0) {
			/* 1 < 0 <= 2 */
			if (cmp(*from3, *from1) < 0) goto state_3102;
			if (cmp(*from3, *from0) < 0) goto state_1302;
			if (cmp(*from3, *from2) < 0) goto state_1032;
			goto state_1023;
		}
		/* 1 <= 2 < 0 */
		if (cmp(*from3, *from1) < 0) goto state_3120;
		if (cmp(*from3, *from2) < 0) goto state_1320;
		if (cmp(*from3, *from0) < 0) goto state_1230;
		goto state_1203;
	}
	/* 2 < 1 < 0 */
	if (cmp(*from3, *from2) < 0) goto state_3210;
	if (cmp(*from3, *from1) < 0) goto state_2310;
	if (cmp(*from3, *from0) < 0) goto state_2130;
	goto state_2103;

#define MAKE_STATE(a,b,c,d)                                                    \
        state_ ## a ## b ## c ## d:                                            \
        assert(cmp(*from ## a, *from ## b) <= 0);                              \
        assert(cmp(*from ## b, *from ## c) <= 0);                              \
        assert(cmp(*from ## c, *from ## d) <= 0);                              \
        *result++ = *from ## a ++;                                             \
        if (--n ## a == 0) goto finish ## a ;                                  \
        if (a < b) if (cmp(*from##a, *from##b) <= 0) goto state_##a##b##c##d;  \
        if (a > b) if (cmp(*from##a, *from##b) <  0) goto state_##a##b##c##d;  \
        if (a < c) if (cmp(*from##a, *from##c) <= 0) goto state_##b##a##c##d;  \
        if (a > c) if (cmp(*from##a, *from##c) <  0) goto state_##b##a##c##d;  \
        if (a < d) if (cmp(*from##a, *from##d) <= 0) goto state_##b##c##a##d;  \
        if (a > d) if (cmp(*from##a, *from##d) <  0) goto state_##b##c##a##d;  \
        goto state_ ## b ## c ## d ## a;

	MAKE_STATE(0, 1, 2, 3); MAKE_STATE(0, 1, 3, 2); MAKE_STATE(0, 2, 1, 3);
	MAKE_STATE(0, 2, 3, 1); MAKE_STATE(0, 3, 1, 2); MAKE_STATE(0, 3, 2, 1);
	MAKE_STATE(1, 0, 2, 3); MAKE_STATE(1, 0, 3, 2); MAKE_STATE(1, 2, 0, 3);
	MAKE_STATE(1, 2, 3, 0); MAKE_STATE(1, 3, 0, 2); MAKE_STATE(1, 3, 2, 0);
	MAKE_STATE(2, 0, 1, 3); MAKE_STATE(2, 0, 3, 1); MAKE_STATE(2, 1, 0, 3);
	MAKE_STATE(2, 1, 3, 0); MAKE_STATE(2, 3, 0, 1); MAKE_STATE(2, 3, 1, 0);
	MAKE_STATE(3, 0, 1, 2); MAKE_STATE(3, 0, 2, 1); MAKE_STATE(3, 1, 0, 2);
	MAKE_STATE(3, 1, 2, 0); MAKE_STATE(3, 2, 0, 1); MAKE_STATE(3, 2, 1, 0);
#undef MAKE_STATE

finish0:
	assert(n0 == 0);
	merge_3way(from1, n1, from2, n2, from3, n3, result);
	return;
finish1:
	assert(n1 == 0);
	merge_3way(from0, n0, from2, n2, from3, n3, result);
	return;
finish2:
	assert(n2 == 0);
	merge_3way(from0, n0, from1, n1, from3, n3, result);
	return;
finish3:
	assert(n3 == 0);
	merge_3way(from0, n0, from1, n1, from2, n2, result);
	return;
}